

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::ModeAdd
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this,idx_t row)

{
  DataChunk *result;
  ulong uVar1;
  ColumnDataScanState *state;
  size_t sVar2;
  char *pcVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  string_t *psVar6;
  ulong uVar7;
  uint uVar8;
  string_t *psVar9;
  key_type k;
  
  state = this->scan;
  if ((state->next_row_index <= row) || (row < state->current_row_index)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,row,state,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (string_t *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = &pvVar4->validity;
  }
  uVar8 = (int)row - (int)this->scan->current_row_index;
  psVar9 = this->data;
  k.value.pointer.ptr = psVar9[uVar8].value.pointer.ptr;
  k.value._0_8_ = *(undefined8 *)&psVar9[uVar8].value;
  pmVar5 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::GetOrCreate(this->frequency_map,k);
  sVar2 = pmVar5->count;
  uVar1 = sVar2 + 1;
  pmVar5->count = uVar1;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar5->first_row = row;
  }
  else {
    uVar7 = pmVar5->first_row;
    if (row < pmVar5->first_row) {
      uVar7 = row;
    }
    pmVar5->first_row = uVar7;
  }
  if (this->count < uVar1) {
    psVar9 = psVar9 + uVar8;
    this->valid = true;
    this->count = uVar1;
    psVar6 = this->mode;
    if (psVar6 == (string_t *)0x0) {
      psVar6 = (string_t *)operator_new(0x10);
      pcVar3 = (psVar9->value).pointer.ptr;
      *(undefined8 *)&psVar6->value = *(undefined8 *)&psVar9->value;
      (psVar6->value).pointer.ptr = pcVar3;
      this->mode = psVar6;
    }
    else {
      pcVar3 = (psVar9->value).pointer.ptr;
      *(undefined8 *)&psVar6->value = *(undefined8 *)&psVar9->value;
      (psVar6->value).pointer.ptr = pcVar3;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}